

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:153:49),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:153:49),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<int> *pEVar1;
  int *in_00;
  int local_5cc;
  ExceptionOr<int> local_5c8;
  int *local_460;
  int *depValue;
  ExceptionOr<int> local_300;
  Exception *local_198;
  Exception *depException;
  undefined1 local_180 [8];
  ExceptionOr<int> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:153:49),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr = (NullableValue<int>)output;
  ExceptionOr<int>::ExceptionOr((ExceptionOr<int> *)local_180);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_180);
  local_198 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_180);
  if (local_198 == (Exception *)0x0) {
    local_460 = readMaybe<int>((Maybe<int> *)
                               ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 +
                               0x150));
    if (local_460 != (int *)0x0) {
      in_00 = mv<int>(local_460);
      local_5cc = MaybeVoidCaller<int,int>::
                  apply<kj::(anonymous_namespace)::TestCase147::run()::__0>(&this->func,in_00);
      handle(&local_5c8,this,&local_5cc);
      pEVar1 = ExceptionOrValue::as<int>((ExceptionOrValue *)depResult.value.ptr);
      ExceptionOr<int>::operator=(pEVar1,&local_5c8);
      ExceptionOr<int>::~ExceptionOr(&local_5c8);
    }
  }
  else {
    in = mv<kj::Exception>(local_198);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x28,in)
    ;
    handle(&local_300,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<int>((ExceptionOrValue *)depResult.value.ptr);
    ExceptionOr<int>::operator=(pEVar1,&local_300);
    ExceptionOr<int>::~ExceptionOr(&local_300);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<int>::~ExceptionOr((ExceptionOr<int> *)local_180);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }